

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Warn.cpp
# Opt level: O0

void __thiscall
WarnIRCCommand::trigger
          (WarnIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  Server *pSVar1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *this_00;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  string *psVar7;
  Config *this_01;
  size_type sVar8;
  char *pcVar9;
  size_type sVar10;
  const_pointer pvVar11;
  undefined8 uVar12;
  size_type sVar13;
  const_pointer pvVar14;
  basic_string_view<char,_std::char_traits<char>_> bVar15;
  undefined8 in_stack_fffffffffffffbb8;
  undefined4 uVar16;
  string local_348;
  __sv_type local_328;
  WarnIRCCommand *local_318;
  size_t sStack_310;
  string local_308;
  __sv_type local_2e8;
  string local_2d8;
  string_view local_2b8;
  __sv_type local_2a8;
  string local_298;
  __sv_type local_278;
  WarnIRCCommand *local_268;
  size_t sStack_260;
  undefined8 local_250;
  string local_248;
  __sv_type local_228;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  string local_208;
  __sv_type local_1e8;
  WarnIRCCommand *local_1d8;
  size_t sStack_1d0;
  string local_1c8;
  __sv_type local_1a8;
  string_view local_198;
  __sv_type local_180;
  uint local_16c;
  undefined4 uStack_168;
  int warns;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  reference local_150;
  Server **server;
  const_iterator __end1;
  const_iterator __begin1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range1;
  PlayerInfo *player;
  string_view reason;
  string_view name;
  size_t local_f8;
  char *local_f0;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> local_d0 [24];
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_b8;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  char *local_a8;
  long local_a0;
  Channel *chan;
  char *local_90;
  WarnIRCCommand *local_88;
  size_t local_80;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_t local_68;
  char *local_60;
  undefined1 local_58 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split;
  IRC_Bot *source_local;
  WarnIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (WarnIRCCommand *)nick._M_len;
  pcVar9 = channel._M_str;
  nick_local._M_str = (char *)channel._M_len;
  local_68 = parameters._M_len;
  local_60 = parameters._M_str;
  parameters_split.second._M_str = (char *)source;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78," \t");
  jessilib::
  word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_58,(jessilib *)&local_68,&local_78,
             (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len);
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     &parameters_split.first._M_str);
  pcVar2 = parameters_split.second._M_str;
  if (bVar4) {
    local_88 = this_local;
    local_80 = nick_local._M_len;
    _chan = sv("Error: Too Few Parameters. Syntax: Warn <Player> <Reason>",0x39);
    Jupiter::IRC::Client::sendNotice(pcVar2,local_88,local_80,chan,local_90);
  }
  else {
    servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)nick_local._M_str;
    local_a8 = pcVar9;
    local_a0 = Jupiter::IRC::Client::getChannel
                         (parameters_split.second._M_str,nick_local._M_str,pcVar9);
    if (local_a0 != 0) {
      RenX::getCore();
      Jupiter::IRC::Client::Channel::getType();
      RenX::Core::getServers((int)local_d0);
      local_b8 = local_d0;
      bVar4 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::empty(local_b8);
      pcVar3 = nick_local._M_str;
      pcVar2 = parameters_split.second._M_str;
      this_00 = local_b8;
      if (bVar4) {
        bVar15 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
        local_f8 = bVar15._M_len;
        local_f0 = bVar15._M_str;
        Jupiter::IRC::Client::sendMessage(pcVar2,pcVar3,pcVar9,local_f8,local_f0);
      }
      else {
        reason._M_str = (char *)local_58;
        player = (PlayerInfo *)parameters_split.first._M_str;
        reason._M_len = parameters_split.second._M_len;
        __end1 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin(local_b8);
        server = (Server **)
                 std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end(this_00);
        while (bVar4 = __gnu_cxx::
                       operator==<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                 (&__end1,(__normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                           *)&server), ((bVar4 ^ 0xffU) & 1) != 0) {
          local_150 = __gnu_cxx::
                      __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                      ::operator*(&__end1);
          if (*local_150 != (Server *)0x0) {
            name._M_len._0_4_ = (undefined4)parameters_split.first._M_len;
            name._M_len._4_4_ = (undefined4)(parameters_split.first._M_len >> 0x20);
            uStack_168 = reason._M_str._0_4_;
            warns = reason._M_str._4_4_;
            uStack_160 = (undefined4)name._M_len;
            uStack_15c = name._M_len._4_4_;
            lVar6 = RenX::Server::getPlayerByPartName
                              (*local_150,reason._M_str,parameters_split.first._M_len);
            if (lVar6 != 0) {
              psVar7 = (string *)Jupiter::Plugin::getName_abi_cxx11_();
              local_180 = std::__cxx11::string::operator_cast_to_basic_string_view(psVar7);
              this_01 = (Config *)
                        Jupiter::Config::operator[](lVar6 + 0x1b8,local_180._M_len,local_180._M_str)
              ;
              local_198 = WARNS_KEY;
              iVar5 = Jupiter::Config::get<int>(this_01,WARNS_KEY,0);
              uVar16 = (undefined4)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
              local_16c = iVar5 + 1;
              if (pluginInstance.m_maxWarns < (int)local_16c) {
                if (pluginInstance.m_warnAction == -1) {
                  pSVar1 = *local_150;
                  string_printf_abi_cxx11_
                            (&local_1c8,"Warning limit reached (%d warnings)",(ulong)local_16c);
                  local_1a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)&local_1c8);
                  RenX::Server::kickPlayer(pSVar1,lVar6,local_1a8._M_len,local_1a8._M_str);
                  std::__cxx11::string::~string((string *)&local_1c8);
                  pcVar2 = parameters_split.second._M_str;
                  local_1d8 = this_local;
                  sStack_1d0 = nick_local._M_len;
                  sVar8 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(lVar6 + 8));
                  pcVar9 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(lVar6 + 8));
                  string_printf_abi_cxx11_
                            (&local_208,
                             "%.*s has been kicked from the server for exceeding the warning limit (%d warnings)."
                             ,sVar8,pcVar9,(ulong)local_16c);
                  local_1e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)&local_208);
                  Jupiter::IRC::Client::sendNotice
                            (pcVar2,local_1d8,sStack_1d0,local_1e8._M_len,local_1e8._M_str);
                  std::__cxx11::string::~string((string *)&local_208);
                }
                else {
                  pSVar1 = *local_150;
                  local_218 = sv("Jupiter Bot/RenX.Warn",0x15);
                  string_printf_abi_cxx11_
                            (&local_248,"Warning limit reached (%d warnings)",(ulong)local_16c);
                  local_228 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)&local_248);
                  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                            ((duration<long,std::ratio<1l,1l>> *)&local_250,
                             &pluginInstance.m_warnAction);
                  uVar12 = local_250;
                  RenX::Server::banPlayer
                            (pSVar1,lVar6,local_218._M_len,local_218._M_str,local_228._M_len,
                             local_228._M_str,local_250);
                  uVar16 = (undefined4)((ulong)uVar12 >> 0x20);
                  std::__cxx11::string::~string((string *)&local_248);
                  pcVar2 = parameters_split.second._M_str;
                  local_268 = this_local;
                  sStack_260 = nick_local._M_len;
                  sVar8 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(lVar6 + 8));
                  pcVar9 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(lVar6 + 8));
                  sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                     ((basic_string_view<char,_std::char_traits<char>_> *)&player);
                  pvVar11 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                      ((basic_string_view<char,_std::char_traits<char>_> *)&player);
                  in_stack_fffffffffffffbb8 = CONCAT44(uVar16,local_16c);
                  string_printf_abi_cxx11_
                            (&local_298,
                             "%.*s has been banned from the server for exceeding the warning limit (%d warnings)."
                             ,sVar8,pcVar9,sVar10,pvVar11,in_stack_fffffffffffffbb8);
                  local_278 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)&local_298);
                  Jupiter::IRC::Client::sendNotice
                            (pcVar2,local_268,sStack_260,local_278._M_len,local_278._M_str);
                  std::__cxx11::string::~string((string *)&local_298);
                }
              }
              else {
                psVar7 = (string *)Jupiter::Plugin::getName_abi_cxx11_();
                local_2a8 = std::__cxx11::string::operator_cast_to_basic_string_view(psVar7);
                uVar12 = Jupiter::Config::operator[]
                                   (lVar6 + 0x1b8,local_2a8._M_len,local_2a8._M_str);
                local_2b8 = WARNS_KEY;
                std::__cxx11::to_string(&local_2d8,local_16c);
                Jupiter::Config::set(uVar12,local_2b8._M_len,local_2b8._M_str,&local_2d8);
                std::__cxx11::string::~string((string *)&local_2d8);
                pSVar1 = *local_150;
                sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&this_local)
                ;
                pvVar11 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local
                                    );
                sVar13 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&player);
                pvVar14 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                    ((basic_string_view<char,_std::char_traits<char>_> *)&player);
                in_stack_fffffffffffffbb8 = CONCAT44(uVar16,local_16c);
                string_printf_abi_cxx11_
                          (&local_308,
                           "You have been warned by %.*s@IRC for: %.*s. You have %d warnings.",
                           sVar10,pvVar11,sVar13,pvVar14,in_stack_fffffffffffffbb8);
                local_2e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((string *)&local_308);
                RenX::Server::sendWarnMessage(pSVar1,lVar6,local_2e8._M_len,local_2e8._M_str);
                std::__cxx11::string::~string((string *)&local_308);
                pcVar2 = parameters_split.second._M_str;
                local_318 = this_local;
                sStack_310 = nick_local._M_len;
                sVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(lVar6 + 8));
                pcVar9 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(lVar6 + 8));
                string_printf_abi_cxx11_
                          (&local_348,"%.*s has been warned; they now have %d warnings.",sVar8,
                           pcVar9,(ulong)local_16c);
                local_328 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((string *)&local_348);
                Jupiter::IRC::Client::sendNotice
                          (pcVar2,local_318,sStack_310,local_328._M_len,local_328._M_str);
                std::__cxx11::string::~string((string *)&local_348);
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
          ::operator++(&__end1);
        }
      }
      std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector(local_d0);
    }
  }
  return;
}

Assistant:

void WarnIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (parameters_split.second.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: Warn <Player> <Reason>"sv);
		return;
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	std::string_view name = parameters_split.first;
	std::string_view reason = parameters_split.second;

	RenX::PlayerInfo *player;
	for (const auto& server : servers) {
		if (server != nullptr) {
			player = server->getPlayerByPartName(name);
			if (player != nullptr) {
				int warns = player->varData[pluginInstance.getName()].get<int>(WARNS_KEY) + 1;
				if (warns > pluginInstance.m_maxWarns) {
					switch (pluginInstance.m_warnAction) {
					case -1:
						server->kickPlayer(*player, string_printf("Warning limit reached (%d warnings)", warns));
						source->sendNotice(nick, string_printf("%.*s has been kicked from the server for exceeding the warning limit (%d warnings).", player->name.size(), player->name.data(), warns));
						break;
					default:
						server->banPlayer(*player, "Jupiter Bot/RenX.Warn"sv, string_printf("Warning limit reached (%d warnings)", warns), std::chrono::seconds(pluginInstance.m_warnAction));
						source->sendNotice(nick, string_printf("%.*s has been banned from the server for exceeding the warning limit (%d warnings).", player->name.size(), player->name.data(), reason.size(), reason.data(), warns));
						break;
					}
				}
				else {
					player->varData[pluginInstance.getName()].set(WARNS_KEY, std::to_string(warns));
					server->sendWarnMessage(*player, string_printf("You have been warned by %.*s@IRC for: %.*s. You have %d warnings.", nick.size(),
						nick.data(), reason.size(), reason.data(), warns));
					source->sendNotice(nick, string_printf("%.*s has been warned; they now have %d warnings.", player->name.size(), player->name.data(), warns));
				}
			}
		}
	}
}